

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTMath.cpp
# Opt level: O0

void __thiscall RTQuaternion::toEuler(RTQuaternion *this,RTVector3 *vec)

{
  double dVar1;
  RTVector3 *vec_local;
  RTQuaternion *this_local;
  
  dVar1 = (double)(this->m_data[1] * this->m_data[1] + this->m_data[2] * this->m_data[2]);
  dVar1 = atan2((double)(this->m_data[2] * this->m_data[3] + this->m_data[0] * this->m_data[1]) *
                2.0,1.0 - (dVar1 + dVar1));
  RTVector3::setX(vec,(float)dVar1);
  dVar1 = asin((double)(this->m_data[0] * this->m_data[2] + -(this->m_data[1] * this->m_data[3])) *
               2.0);
  RTVector3::setY(vec,(float)dVar1);
  dVar1 = (double)(this->m_data[2] * this->m_data[2] + this->m_data[3] * this->m_data[3]);
  dVar1 = atan2((double)(this->m_data[1] * this->m_data[2] + this->m_data[0] * this->m_data[3]) *
                2.0,1.0 - (dVar1 + dVar1));
  RTVector3::setZ(vec,(float)dVar1);
  return;
}

Assistant:

void RTQuaternion::toEuler(RTVector3& vec)
{
    vec.setX(atan2(2.0 * (m_data[2] * m_data[3] + m_data[0] * m_data[1]),
            1 - 2.0 * (m_data[1] * m_data[1] + m_data[2] * m_data[2])));

    vec.setY(asin(2.0 * (m_data[0] * m_data[2] - m_data[1] * m_data[3])));

    vec.setZ(atan2(2.0 * (m_data[1] * m_data[2] + m_data[0] * m_data[3]),
            1 - 2.0 * (m_data[2] * m_data[2] + m_data[3] * m_data[3])));
}